

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_functions.cc
# Opt level: O0

void absl::lts_20250127::cord_internal::set_cordz_mean_interval(int32_t mean_interval)

{
  int32_t mean_interval_local;
  memory_order __b;
  
  std::operator&(memory_order_release,__memory_order_mask);
  (anonymous_namespace)::g_cordz_mean_interval = mean_interval;
  return;
}

Assistant:

void set_cordz_mean_interval(int32_t mean_interval) {
  g_cordz_mean_interval.store(mean_interval, std::memory_order_release);
}